

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

void __thiscall
Hpipe::Instruction::apply_rec
          (Instruction *this,function<void_(Hpipe::Instruction_*)> *f,bool subgraphs)

{
  pointer pTVar1;
  Instruction *pIVar2;
  pointer pTVar3;
  Instruction *local_58;
  _Any_data local_50;
  code *local_40;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    local_58 = this;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*f->_M_invoker)((_Any_data *)f,&local_58);
    pTVar3 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar3 != pTVar1) {
      do {
        pIVar2 = pTVar3->inst;
        if (pIVar2 != (Instruction *)0x0) {
          std::function<void_(Hpipe::Instruction_*)>::function
                    ((function<void_(Hpipe::Instruction_*)> *)&local_50,f);
          (*pIVar2->_vptr_Instruction[6])(pIVar2,&local_50,(ulong)subgraphs);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
        }
        pTVar3 = pTVar3 + 1;
      } while (pTVar3 != pTVar1);
    }
  }
  return;
}

Assistant:

void Instruction::apply_rec( std::function<void (Instruction *)> f, bool subgraphs ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    f( this );

    for( Transition &t : next )
        if ( t.inst )
            t.inst->apply_rec( f, subgraphs );
}